

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

void __thiscall
Clasp::DynamicLimit::DynamicLimit
          (DynamicLimit *this,float k,uint32 size,Type fast,Keep keep,Type slow,uint32 slowSize,
          uint32 adjustLim)

{
  uint32 uVar1;
  Type t;
  Keep in_ECX;
  DynamicLimit *in_RDI;
  int in_R8D;
  float in_R9D;
  MovingAvg *pMVar2;
  uint32 in_stack_ffffffffffffffb8;
  
  if ((in_R9D == 0.0) && (in_R8D != 0)) {
    uVar1 = verifySize(0);
    in_R9D = (float)(uVar1 * 200);
  }
  Global::Global((Global *)in_RDI,(Type)in_R9D,in_stack_ffffffffffffffb8);
  pMVar2 = &in_RDI->avg_;
  t = verifySize(0);
  MovingAvg::MovingAvg((MovingAvg *)in_RDI,(uint32)in_R9D,t);
  in_RDI->num_ = 0;
  in_RDI->keep_ = in_ECX;
  resetAdjust(in_RDI,in_R9D,t,(uint32)((ulong)pMVar2 >> 0x20),SUB81((ulong)pMVar2 >> 0x18,0));
  return;
}

Assistant:

DynamicLimit::DynamicLimit(float k, uint32 size, MovingAvg::Type fast, Keep keep, MovingAvg::Type slow, uint32 slowSize, uint32 adjustLim)
	: global_(slow, slowSize || slow == MovingAvg::avg_sma ? slowSize : 200 * verifySize(size))
	, avg_(verifySize(size), fast)
	, num_(0)
	, keep_(keep) {
	resetAdjust(k, lbd_limit, adjustLim);
}